

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<GPollFDWithQSocketNotifier_*>::relocate
          (QArrayDataPointer<GPollFDWithQSocketNotifier_*> *this,qsizetype offset,
          GPollFDWithQSocketNotifier ***data)

{
  GPollFDWithQSocketNotifier **d_first;
  GPollFDWithQSocketNotifier **ppGVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<GPollFDWithQSocketNotifier*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (GPollFDWithQSocketNotifier ***)0x0) {
    ppGVar1 = *data;
    if ((this->ptr <= ppGVar1) && (ppGVar1 < this->ptr + this->size)) {
      *data = ppGVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }